

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void do_free_pn_space(st_quicly_pn_space_t *space)

{
  quicly_range_t *__ptr;
  
  __ptr = (space->ack_queue).ranges;
  if (__ptr != &(space->ack_queue)._initial) {
    free(__ptr);
  }
  free(space);
  return;
}

Assistant:

static void do_free_pn_space(struct st_quicly_pn_space_t *space)
{
    quicly_ranges_clear(&space->ack_queue);
    free(space);
}